

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::UnionSchema::addType(UnionSchema *this,Schema *typeSchema)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  type pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NodePtr *this_00;
  Schema *in_RSI;
  allocator<char> *in_RDI;
  NodePtr *leaf;
  size_t i;
  size_t types;
  string *in_stack_ffffffffffffff38;
  Exception *in_stack_ffffffffffffff40;
  Name *in_stack_ffffffffffffff48;
  Name *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ulong local_58;
  
  TVar2 = Schema::type((Schema *)0x2206a1);
  if (TVar2 == AVRO_UNION) {
    uVar5 = __cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
               in_RDI);
    Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
  }
  TVar2 = Schema::type((Schema *)0x220793);
  if (TVar2 == AVRO_RECORD) {
    pNVar6 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 8));
    iVar3 = (*pNVar6->_vptr_Node[4])();
    for (local_58 = 0; local_58 < CONCAT44(extraout_var,iVar3); local_58 = local_58 + 1) {
      pNVar6 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 8));
      iVar4 = (*pNVar6->_vptr_Node[5])(pNVar6,local_58 & 0xffffffff);
      pNVar6 = boost::shared_ptr<avro::Node>::operator->
                         ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_00,iVar4));
      TVar2 = Node::type(pNVar6);
      if (TVar2 == AVRO_RECORD) {
        pNVar6 = boost::shared_ptr<avro::Node>::operator->
                           ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_00,iVar4));
        (*pNVar6->_vptr_Node[3])();
        this_00 = Schema::root(in_RSI);
        pNVar6 = boost::shared_ptr<avro::Node>::operator->(this_00);
        (*pNVar6->_vptr_Node[3])();
        bVar1 = Name::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (bVar1) {
          uVar7 = 1;
          uVar5 = __cxa_allocate_exception(0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff80,
                     (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                      CONCAT16(uVar7,in_stack_ffffffffffffff78)),in_RDI);
          Exception::Exception(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
  }
  pNVar6 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 8));
  Schema::root(in_RSI);
  Node::addLeaf(pNVar6,(NodePtr *)in_stack_ffffffffffffff38);
  return;
}

Assistant:

void
UnionSchema::addType(const Schema &typeSchema) 
{
    if(typeSchema.type() == AVRO_UNION) {
        throw Exception("Cannot add unions to unions");
    }

    if(typeSchema.type() == AVRO_RECORD) {
        // check for duplicate records
        size_t types = node_->leaves();
        for(size_t i = 0; i < types; ++i) {
            const NodePtr &leaf = node_->leafAt(i);
            // TODO, more checks?
            if(leaf->type() == AVRO_RECORD && leaf->name() == typeSchema.root()->name()) {
                throw Exception("Records in unions cannot have duplicate names");
            }
        }
    }

    node_->addLeaf(typeSchema.root());
}